

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O3

int __thiscall MeCab::Connector::open(Connector *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  ushort uVar2;
  Mmap<short> *pMVar3;
  ushort *puVar4;
  ulong uVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  whatlog *pwVar11;
  
  iVar6 = Mmap<short>::open((this->cmmap_).ptr_,__file,__oflag);
  if ((char)iVar6 == '\0') {
    pwVar11 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar11,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar11,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar11,0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"cmmap_->open(filename, mode)",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    pcVar10 = "cannot open: ";
    lVar9 = 0xd;
  }
  else {
    pMVar3 = (this->cmmap_).ptr_;
    puVar4 = (ushort *)pMVar3->text;
    this->matrix_ = (short *)puVar4;
    if (puVar4 == (ushort *)0x0) {
      pwVar11 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar11,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar11,0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"matrix_",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"matrix is NULL",0xe);
      return 0;
    }
    uVar5 = pMVar3->length;
    if (uVar5 < 4) {
      pwVar11 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar11,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar11,0x1e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
      pcVar10 = "cmmap_->size() >= 2";
      lVar9 = 0x13;
    }
    else {
      uVar1 = *puVar4;
      this->lsize_ = uVar1;
      uVar2 = puVar4[1];
      this->rsize_ = uVar2;
      if ((ulong)uVar2 * (ulong)uVar1 + 2 == uVar5 >> 1) {
        this->matrix_ = (short *)(puVar4 + 2);
        return (int)CONCAT71((int7)((ulong)__file >> 8),1);
      }
      pwVar11 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar11,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar11,0x25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
      pcVar10 = "static_cast<size_t>(lsize_ * rsize_ + 2) == cmmap_->size()";
      lVar9 = 0x3a;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    pcVar10 = "file size is invalid: ";
    lVar9 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar9);
  if (__file == (char *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar8 = strlen(__file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,__file,sVar8);
  }
  return 0;
}

Assistant:

bool Connector::open(const char* filename,
                     const char *mode) {
  CHECK_FALSE(cmmap_->open(filename, mode))
      << "cannot open: " << filename;

  matrix_ = cmmap_->begin();

  CHECK_FALSE(matrix_) << "matrix is NULL" ;
  CHECK_FALSE(cmmap_->size() >= 2)
      << "file size is invalid: " << filename;

  lsize_ = static_cast<unsigned short>((*cmmap_)[0]);
  rsize_ = static_cast<unsigned short>((*cmmap_)[1]);

  CHECK_FALSE(static_cast<size_t>(lsize_ * rsize_ + 2)
                    == cmmap_->size())
      << "file size is invalid: " << filename;

  matrix_ = cmmap_->begin() + 2;
  return true;
}